

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O2

__m256i * highbd_clamp_epi16_avx2(__m256i *__return_storage_ptr__,__m256i u,int bd)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  __m256i *in_RAX;
  undefined1 in_ZMM0 [64];
  undefined1 auVar3 [32];
  
  auVar3._8_2_ = 1;
  auVar3._0_8_ = 0x1000100010001;
  auVar3._10_2_ = 1;
  auVar3._12_2_ = 1;
  auVar3._14_2_ = 1;
  auVar3._16_2_ = 1;
  auVar3._18_2_ = 1;
  auVar3._20_2_ = 1;
  auVar3._22_2_ = 1;
  auVar3._24_2_ = 1;
  auVar3._26_2_ = 1;
  auVar3._28_2_ = 1;
  auVar3._30_2_ = 1;
  auVar2 = vpsllw_avx2(auVar3,ZEXT416((uint)__return_storage_ptr__));
  auVar3 = vpcmpeqd_avx2(auVar3,auVar3);
  auVar3 = vpaddw_avx2(auVar2,auVar3);
  auVar1 = vpcmpgtw_avx2(in_ZMM0._0_32_,auVar3);
  auVar2 = vpandn_avx2(auVar1,in_ZMM0._0_32_);
  auVar3 = vpand_avx2(auVar1,auVar3);
  auVar2 = vpor_avx2(auVar2,auVar3);
  auVar3 = vpcmpgtw_avx2(auVar2,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
  vpand_avx2(auVar2,auVar3);
  return in_RAX;
}

Assistant:

static inline __m256i highbd_clamp_epi16_avx2(__m256i u, int bd) {
  const __m256i zero = _mm256_setzero_si256();
  const __m256i one = _mm256_set1_epi16(1);
  const __m256i max = _mm256_sub_epi16(_mm256_slli_epi16(one, bd), one);
  __m256i clamped, mask;

  mask = _mm256_cmpgt_epi16(u, max);
  clamped = _mm256_andnot_si256(mask, u);
  mask = _mm256_and_si256(mask, max);
  clamped = _mm256_or_si256(mask, clamped);
  mask = _mm256_cmpgt_epi16(clamped, zero);
  clamped = _mm256_and_si256(clamped, mask);

  return clamped;
}